

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  WeaponReceiver *weapon;
  Commander *this;
  
  weapon = (WeaponReceiver *)operator_new(8);
  Tank::Tank((Tank *)weapon);
  this = (Commander *)operator_new(0x10);
  Commander::Commander(this,weapon);
  Commander::order(this,ORDER_FIRE);
  Commander::order(this,ORDER_MOVE);
  Commander::order(this,ORDER_RELOAD);
  (*this->_vptr_Commander[1])(this);
  (*weapon->_vptr_WeaponReceiver[4])(weapon);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	Tank *tank = new Tank();
	Commander *commander = new Commander(tank);

	commander->order(Commander::ORDER_FIRE);
	commander->order(Commander::ORDER_MOVE);
	commander->order(Commander::ORDER_RELOAD);

	delete commander;
	delete tank;

	return 0;
}